

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O0

int I_FindClose(void *handle)

{
  undefined4 local_1c;
  int i;
  findstate_t *state;
  void *handle_local;
  
  if ((handle != (void *)0xffffffffffffffff) && (0 < *handle)) {
    for (local_1c = 0; local_1c < *handle; local_1c = local_1c + 1) {
      free(*(void **)(*(long *)((long)handle + 8) + (long)local_1c * 8));
    }
    *(undefined4 *)handle = 0;
    free(*(void **)((long)handle + 8));
    *(undefined8 *)((long)handle + 8) = 0;
  }
  return 0;
}

Assistant:

int I_FindClose (void *handle)
{
	findstate_t *state = (findstate_t *)handle;
	if (handle != (void*)-1 && state->count > 0)
	{
		for(int i = 0;i < state->count;++i)
			free (state->namelist[i]);
		state->count = 0;
		free (state->namelist);
		state->namelist = NULL;
	}
	return 0;
}